

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O0

uint4 __thiscall GrammarLexer::moveState(GrammarLexer *this,char lookahead)

{
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [38];
  bool local_82;
  allocator local_81;
  string local_80 [6];
  bool syntaxerror;
  allocator local_49;
  string local_48 [39];
  char local_21;
  uint4 local_20;
  bool newline;
  uint4 res;
  char lookahead_local;
  GrammarLexer *this_local;
  
  local_21 = '\0';
  newline = (bool)lookahead;
  _res = this;
  if (lookahead < ' ') {
    if ((((lookahead != '\t') && (lookahead != '\v')) && (lookahead != '\f')) && (lookahead != '\r')
       ) {
      if (lookahead != '\n') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_48,"Illegal character",&local_49);
        setError(this,(string *)local_48);
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        return 0x100;
      }
      local_21 = '\x01';
    }
    newline = true;
  }
  else if ('~' < lookahead) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Illegal character",&local_81);
    setError(this,(string *)local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    return 0x100;
  }
  local_20 = 0;
  local_82 = false;
  switch(this->state) {
  case 0:
    switch(newline) {
    case true:
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"Illegal character",&local_a9);
      setError(this,(string *)local_a8);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      return 0x100;
    case true:
      this->state = 8;
      this->bufstart = this->bufend + -1;
      break;
    case true:
      this->state = 10;
      break;
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
      this->state = 5;
      this->bufstart = this->bufend + -1;
      break;
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
      this->state = 0xd;
      this->bufstart = this->bufend + -1;
      break;
    case true:
      this->state = 2;
      break;
    case true:
      this->state = 1;
      break;
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
    case true:
      this->state = 0xe;
      this->bufstart = this->bufend + -1;
    }
    break;
  case 1:
    if (newline == true) {
      this->state = 7;
    }
    else {
      local_82 = newline != true;
      if (!local_82) {
        this->state = 6;
      }
    }
    break;
  case 2:
    local_82 = newline != true;
    if (!local_82) {
      this->state = 3;
    }
    break;
  case 3:
    local_82 = newline != true;
    if (!local_82) {
      this->state = 4;
    }
    break;
  case 4:
    this->state = 0;
    local_20 = 0x102;
    break;
  case 5:
    this->state = 0;
    local_20 = (uint4)this->buffer[this->bufstart];
    break;
  case 6:
    if (local_21 != '\0') {
      this->state = 0;
    }
    break;
  case 7:
    if (((newline == true) && (1 < this->bufend)) && (this->buffer[this->bufend + -2] == '*')) {
      this->state = 0;
    }
    break;
  case 8:
    if (newline == true) {
      this->state = 9;
    }
    break;
  case 9:
    this->state = 0;
    local_20 = 0x106;
    break;
  case 10:
    if (newline == true) {
      this->state = 0xc;
    }
    else if (newline == true) {
      this->state = 0xb;
    }
    break;
  case 0xb:
    this->state = 0;
    local_20 = 0x104;
    break;
  case 0xc:
    this->state = 10;
    break;
  case 0xd:
    if (newline == true) {
      if ((this->bufend - this->bufstart != 2) || (this->buffer[this->bufstart] != '0')) {
        local_82 = true;
      }
    }
    else if ((((newline < '0') || ('9' < newline)) && ((newline < 'A' || ('Z' < newline)))) &&
            (((newline < 'a' || ('z' < newline)) && (newline != true)))) {
      this->state = 0;
      local_20 = 0x103;
    }
    break;
  case 0xe:
    if (((((newline < '0') || ('9' < newline)) && ((newline < 'A' || ('Z' < newline)))) &&
        ((newline < 'a' || ('z' < newline)))) && (newline != true)) {
      this->state = 0;
      local_20 = 0x105;
    }
  }
  if (local_82 == false) {
    if (local_21 != '\0') {
      bumpLine(this);
    }
    this_local._4_4_ = local_20;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Syntax error",&local_d1);
    setError(this,(string *)local_d0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    this_local._4_4_ = 0x100;
  }
  return this_local._4_4_;
}

Assistant:

uint4 GrammarLexer::moveState(char lookahead)

{ // Change finite state machine based on lookahead
  uint4 res;
  bool newline = false;

  if (lookahead<32) {
    if ((lookahead == 9)||(lookahead==11)||(lookahead==12)||
	(lookahead==13))
      lookahead = ' ';
    else if (lookahead == '\n') {
      newline = true;
      lookahead = ' ';
    }
    else {
      setError("Illegal character");
      return GrammarToken::badtoken;
    }
  }
  else if (lookahead >= 127) {
    setError("Illegal character");
    return GrammarToken::badtoken;
  }

  res = 0;
  bool syntaxerror = false;
  switch(state) {
  case start:
    switch(lookahead) {
    case '/':
      state = slash;
      break;
    case '.':
      state = dot1;
      break;
    case '*':
    case ',':
    case '(':
    case ')':
    case '[':
    case ']':
    case '{':
    case '}':
    case ';':
    case '=':
      state = punctuation;
      bufstart = bufend-1;
      break;
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      state = number;
      bufstart = bufend-1;
      break;
    case ' ':
      break;			// Ignore since we are already open
    case '\"':
      state = doublequote;
      bufstart = bufend-1;
      break;
    case '\'':
      state = singlequote;
      break;
    case 'a':
    case 'b':
    case 'c':
    case 'd':
    case 'e':
    case 'f':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
    case 's':
    case 't':
    case 'u':
    case 'v':
    case 'w':
    case 'x':
    case 'y':
    case 'z':
    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
    case 'N':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
    case 'U':
    case 'V':
    case 'W':
    case 'X':
    case 'Y':
    case 'Z':
    case '_':
      state = identifier;
      bufstart = bufend-1;
      break;
    default:
      setError("Illegal character");
      return GrammarToken::badtoken;
    }
    break;
  case slash:
    if (lookahead=='*')
      state = c_comment;
    else if (lookahead == '/')
      state = endofline_comment;
    else
      syntaxerror = true;
    break;
  case dot1:
    if (lookahead=='.')
      state = dot2;
    else
      syntaxerror = true;
    break;
  case dot2:
    if (lookahead=='.')
      state = dot3;
    else
      syntaxerror = true;
    break;
  case dot3:
    state = start;
    res = GrammarToken::dotdotdot;
    break;
  case punctuation:
    state = start;
    res = (uint4)buffer[bufstart];
    break;
  case endofline_comment:
    if (newline)
      state = start;
    break;			// Anything else is part of comment
  case c_comment:
    if (lookahead == '/') {
      if ((bufend >1)&&(buffer[bufend-2]=='*'))
	state = start;
    }
    break;			// Anything else is part of comment
  case doublequote:
    if (lookahead == '\"')
      state = doublequoteend;
    break;			// Anything else is part of string
  case doublequoteend:
    state = start;
    res = GrammarToken::stringval;
    break;
  case singlequote:
    if (lookahead == '\\')
      state = singlebackslash;
    else if (lookahead == '\'')
      state = singlequoteend;
    break;			// Anything else is part of string
  case singlequoteend:
    state = start;
    res = GrammarToken::charconstant;
    break;
  case singlebackslash:	// Seen backslash in a single quoted string
    state = singlequote;
    break;
  case number:
    if (lookahead=='x') {
      if (((bufend-bufstart)!=2)||(buffer[bufstart]!='0'))
	syntaxerror = true;	// x only allowed as 0x hex indicator
    }
    else if ((lookahead>='0')&&(lookahead<='9')) {
    }
    else if ((lookahead>='A')&&(lookahead<='Z')) {
    }
    else if ((lookahead>='a')&&(lookahead<='z')) {
    }
    else if (lookahead == '_') {
    }
    else {
      state = start;
      res = GrammarToken::integer;
    }
    break;
  case identifier:
    if ((lookahead>='0')&&(lookahead<='9')) {
    }
    else if ((lookahead>='A')&&(lookahead<='Z')) {
    }
    else if ((lookahead>='a')&&(lookahead<='z')) {
    }
    else if (lookahead == '_') {
    }
    else {
      state = start;
      res = GrammarToken::identifier;
    }
    break;
  }
  if (syntaxerror) {
    setError("Syntax error");
    return GrammarToken::badtoken;
  }
  if (newline) bumpLine();
  return res;
}